

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

void line_to_examples_json<true>(vw *all,char *line,size_t num_chars,v_array<example_*> *examples)

{
  uint64_t *puVar1;
  parser *ppVar2;
  bool bVar3;
  example *ae;
  substring example;
  char empty;
  char local_29;
  example *local_28;
  
  bVar3 = parse_line_json<true>(all,line,num_chars,examples);
  if (bVar3) {
    if ((ulong)((long)examples->_end - (long)examples->_begin) < 9) {
      return;
    }
    ppVar2 = all->p;
    ae = VW::object_pool<example,_example_initializer>::get_object(&ppVar2->example_pool);
    ae->in_use = true;
    puVar1 = &ppVar2->begin_parsed_examples;
    *puVar1 = *puVar1 + 1;
    local_29 = '\0';
    example.end = &local_29;
    example.begin = &local_29;
    substring_to_example(all,ae,example);
    local_28 = ae;
  }
  else {
    VW::return_multiple_example(all,examples);
    ppVar2 = all->p;
    local_28 = VW::object_pool<example,_example_initializer>::get_object(&ppVar2->example_pool);
    local_28->in_use = true;
    puVar1 = &ppVar2->begin_parsed_examples;
    *puVar1 = *puVar1 + 1;
  }
  v_array<example_*>::push_back(examples,&local_28);
  return;
}

Assistant:

void line_to_examples_json(vw* all, char* line, size_t num_chars, v_array<example*>& examples)
{
  bool good_example = parse_line_json<audit>(all, line, num_chars, examples);
  if (!good_example)
  {
    VW::return_multiple_example(*all, examples);
    examples.push_back(&VW::get_unused_example(all));
    return;
  }

  prepare_for_learner(all, examples);
}